

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_flash_attn_back(ggml_compute_params *params,bool masked,ggml_tensor *dst)

{
  long in_RDX;
  ggml_tensor *q;
  ggml_tensor *in_stack_000002e0;
  bool in_stack_000002ef;
  ggml_compute_params *in_stack_000002f0;
  
  if (**(int **)(in_RDX + 0x98) == 0) {
    ggml_compute_forward_flash_attn_back_f32(in_stack_000002f0,in_stack_000002ef,in_stack_000002e0);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1d05,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_flash_attn_back(
        const ggml_compute_params * params,
        const bool masked,
        ggml_tensor * dst) {

    const ggml_tensor * q = dst->src[0];

    switch (q->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_flash_attn_back_f32(params, masked, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}